

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::ReverseLayerParams::_internal_add_reversedim
          (ReverseLayerParams *this,bool value)

{
  bool local_11;
  ReverseLayerParams *pRStack_10;
  bool value_local;
  ReverseLayerParams *this_local;
  
  local_11 = value;
  pRStack_10 = this;
  google::protobuf::RepeatedField<bool>::Add(&this->reversedim_,&local_11);
  return;
}

Assistant:

inline void ReverseLayerParams::_internal_add_reversedim(bool value) {
  reversedim_.Add(value);
}